

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

void mqtt_recv_consume(Curl_easy *data,size_t nbytes)

{
  void *pvVar1;
  size_t sVar2;
  size_t rlen;
  MQTT *mq;
  size_t nbytes_local;
  Curl_easy *data_local;
  
  pvVar1 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  if (pvVar1 != (void *)0x0) {
    sVar2 = Curl_dyn_len((dynbuf *)((long)pvVar1 + 0x20));
    if (nbytes < sVar2) {
      Curl_dyn_tail((dynbuf *)((long)pvVar1 + 0x20),sVar2 - nbytes);
    }
    else {
      Curl_dyn_reset((dynbuf *)((long)pvVar1 + 0x20));
    }
  }
  return;
}

Assistant:

static void mqtt_recv_consume(struct Curl_easy *data, size_t nbytes)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  DEBUGASSERT(mq);
  if(mq) {
    size_t rlen = Curl_dyn_len(&mq->recvbuf);
    if(rlen <= nbytes)
      Curl_dyn_reset(&mq->recvbuf);
    else
      Curl_dyn_tail(&mq->recvbuf, rlen - nbytes);
  }
}